

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O2

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  pointer pbVar1;
  pointer value;
  Rep *pRVar2;
  InnerProductLayerParams *pIVar3;
  Model *m_00;
  __type _Var4;
  int iVar5;
  int iVar6;
  ModelDescription *pMVar7;
  FeatureDescription *pFVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  DictionaryFeatureType *this;
  NeuralNetworkClassifier *pNVar11;
  StringVector *this_00;
  Int64Vector *this_01;
  NeuralNetworkLayer *pNVar12;
  WeightParams *pWVar13;
  pointer pbVar14;
  vector<long,_std::allocator<long>_> *pvVar15;
  uint64 uVar16;
  Rep *pRVar17;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> *pvVar18;
  float *pfVar19;
  long lVar20;
  undefined7 in_register_00000031;
  undefined7 in_register_00000089;
  uint64 uVar21;
  void **ppvVar22;
  char cVar23;
  uint64_t j;
  TensorAttributes *pTVar24;
  uint64 uVar25;
  uint64_t j_1;
  initializer_list<long> __l;
  allocator_type local_13a;
  less<long> local_139;
  InnerProductLayerParams *local_138;
  TensorAttributes *local_130;
  NeuralNetworkLayer *local_128;
  NeuralNetworkClassifier *local_120;
  undefined4 local_118;
  undefined4 local_114;
  undefined8 local_110;
  vector<long,_std::allocator<long>_> *local_108;
  Model *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  local_114 = (undefined4)CONCAT71(in_register_00000089,includeBias);
  local_118 = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  local_138 = (InnerProductLayerParams *)
              (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_128 = (NeuralNetworkLayer *)
              (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_108 = intClassLabels;
  pMVar7 = CoreML::Specification::Model::mutable_description(m);
  pFVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar7->input_);
  pFVar9 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar9);
  pAVar10 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar9);
  className._M_dataplus._M_p = (pointer)(long)inTensorAttr->dimension;
  google::protobuf::RepeatedField<long>::Add(&pAVar10->shape_,(long *)&className);
  pAVar10->datatype_ = 0x10040;
  local_130 = inTensorAttr;
  CoreML::Specification::FeatureDescription::set_name(pFVar8,inTensorAttr->name);
  if (pFVar8->type_ != (FeatureType *)0x0) {
    (*(pFVar8->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar8->type_ = pFVar9;
  pMVar7 = CoreML::Specification::Model::mutable_description(m);
  pFVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar7->output_);
  pFVar9 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar9);
  pNVar12 = local_128;
  pIVar3 = local_138;
  if (local_128 == (NeuralNetworkLayer *)local_138) {
    CoreML::Specification::FeatureType::mutable_int64type(pFVar9);
  }
  else {
    CoreML::Specification::FeatureType::mutable_stringtype(pFVar9);
  }
  CoreML::Specification::FeatureDescription::set_name(pFVar8,"predictedClass");
  if (pFVar8->type_ != (FeatureType *)0x0) {
    (*(pFVar8->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar8->type_ = pFVar9;
  pMVar7 = CoreML::Specification::Model::mutable_description(m);
  pFVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar7->output_);
  pFVar9 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar9);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar9);
  if (pNVar12 == (NeuralNetworkLayer *)pIVar3) {
    CoreML::Specification::DictionaryFeatureType::mutable_int64keytype(this);
  }
  else {
    CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  }
  CoreML::Specification::FeatureDescription::set_name(pFVar8,"classProbabilities");
  if (pFVar8->type_ != (FeatureType *)0x0) {
    (*(pFVar8->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar8->type_ = pFVar9;
  pMVar7 = CoreML::Specification::Model::mutable_description(m);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar7,"predictedClass");
  pMVar7 = CoreML::Specification::Model::mutable_description(m);
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname
            (pMVar7,"classProbabilities");
  pNVar11 = CoreML::Specification::Model::mutable_neuralnetworkclassifier(m);
  pvVar15 = local_108;
  pTVar24 = local_130;
  local_120 = pNVar11;
  local_100 = m;
  if (pNVar12 == (NeuralNetworkLayer *)pIVar3) {
    pbVar14 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_108->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
              super__Vector_impl_data._M_start;
    pbVar1 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_108->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
             super__Vector_impl_data._M_finish;
    local_110 = 3;
    for (; pvVar18 = pvVar15, pTVar24 = local_130, pbVar14 != pbVar1;
        pbVar14 = (pointer)&pbVar14->_M_string_length) {
      value = (pbVar14->_M_dataplus)._M_p;
      this_01 = CoreML::Specification::NeuralNetworkClassifier::mutable_int64classlabels(pNVar11);
      CoreML::Specification::Int64Vector::add_vector(this_01,(int64)value);
    }
  }
  else {
    pbVar14 = (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (stringClassLabels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_110 = 5;
    for (; pvVar15 = local_108, pvVar18 = (vector<long,_std::allocator<long>_> *)stringClassLabels,
        pbVar14 != pbVar1; pbVar14 = pbVar14 + 1) {
      std::__cxx11::string::string((string *)&className,(string *)pbVar14);
      this_00 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(local_120)
      ;
      CoreML::Specification::StringVector::add_vector(this_00,&className);
      std::__cxx11::string::~string((string *)&className);
    }
  }
  local_130 = (TensorAttributes *)&local_120->layers_;
  pNVar12 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_130);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar12,"inner_product");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar12,pTVar24->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar12,"intermediateOutput");
  if (local_128 == (NeuralNetworkLayer *)local_138) {
    stringClassLabels =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)pvVar15;
  }
  iVar6 = pTVar24->dimension;
  uVar21 = (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&((vector<long,_std::allocator<long>_> *)stringClassLabels)->
                       super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                 super__Vector_impl_data._M_finish -
           (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&pvVar18->super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
                 super__Vector_impl_data._M_start >> ((byte)local_110 & 0x3f);
  local_128 = pNVar12;
  local_138 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar12);
  local_138->inputchannels_ = (long)iVar6;
  local_138->outputchannels_ = uVar21;
  pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_weights(local_138);
  className._M_dataplus._M_p = className._M_dataplus._M_p & 0xffffffff00000000;
  google::protobuf::RepeatedField<float>::Resize
            (&pWVar13->floatvalue_,iVar6 * (int)uVar21,(float *)&className);
  pRVar17 = (pWVar13->floatvalue_).rep_;
  pfVar19 = pRVar17->elements;
  if (pRVar17 == (Rep *)0x0) {
    pfVar19 = (float *)0x0;
  }
  for (uVar16 = 0; uVar16 != (long)iVar6; uVar16 = uVar16 + 1) {
    for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
      iVar5 = rand();
      pfVar19[uVar25] = (float)iVar5 * 4.656613e-10;
    }
    pfVar19 = pfVar19 + uVar21;
  }
  cVar23 = (char)local_114;
  if (cVar23 != '\0') {
    local_138->hasbias_ = true;
    pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_bias(local_138);
    className._M_dataplus._M_p = className._M_dataplus._M_p & 0xffffffff00000000;
    google::protobuf::RepeatedField<float>::Resize
              (&pWVar13->floatvalue_,(int)uVar21,(float *)&className);
    pRVar17 = (pWVar13->floatvalue_).rep_;
    if (pRVar17 != (Rep *)0x0) {
      pRVar17 = (Rep *)pRVar17->elements;
    }
    for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
      iVar6 = rand();
      pRVar17->elements[uVar16 - 2] = (float)iVar6 * 4.656613e-10;
    }
  }
  pNVar12 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_130);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar12,"softmax");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar12,"intermediateOutput");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar12,"scoreVector");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(pNVar12);
  m_00 = local_100;
  pIVar3 = local_138;
  if ((char)local_118 != '\0') {
    local_100->isupdatable_ = true;
    local_128->isupdatable_ = true;
    pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_weights(local_138);
    pWVar13->isupdatable_ = true;
    if (cVar23 != '\0') {
      pWVar13 = CoreML::Specification::InnerProductLayerParams::mutable_bias(pIVar3);
      pWVar13->isupdatable_ = true;
    }
    pNVar11 = local_120;
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (m_00,local_120,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar11,kSgdOptimizer,0.699999988079071,0.0,1.0);
    className.field_2._M_allocated_capacity = 0x40;
    className.field_2._8_8_ = 0x80;
    className._M_dataplus._M_p = (pointer)0x10;
    className._M_string_length = 0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)&className;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,__l,&local_139,
               &local_13a);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar11,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar11,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar11,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    pMVar7 = CoreML::Specification::Model::mutable_description(m_00);
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar7->traininginput_).super_RepeatedPtrFieldBase);
    pMVar7 = m_00->description_;
    if (pMVar7 == (ModelDescription *)0x0) {
      pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (pMVar7->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar22 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar22 = (void **)0x0;
    }
    iVar6 = (pMVar7->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar20 = 0; (long)iVar6 * 8 != lVar20; lVar20 = lVar20 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&className,*(FeatureDescription **)((long)ppvVar22 + lVar20))
      ;
      pMVar7 = CoreML::Specification::Model::mutable_description(m_00);
      pFVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar7->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar8,(FeatureDescription *)&className);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&className);
    }
    pMVar7 = m_00->description_;
    if (pMVar7 == (ModelDescription *)0x0) {
      pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar2 = (pMVar7->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar22 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar22 = (void **)0x0;
    }
    iVar6 = (pMVar7->output_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar20 = 0; (long)iVar6 * 8 != lVar20; lVar20 = lVar20 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&className,*(FeatureDescription **)((long)ppvVar22 + lVar20))
      ;
      pMVar7 = m_00->description_;
      if (pMVar7 == (ModelDescription *)0x0) {
        pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
      }
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              className.field_2._M_allocated_capacity,
                              (pMVar7->predictedfeaturename_).ptr_);
      if (_Var4) {
        pMVar7 = CoreML::Specification::Model::mutable_description(m_00);
        pFVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                           (&pMVar7->traininginput_);
        CoreML::Specification::FeatureDescription::CopyFrom(pFVar8,(FeatureDescription *)&className)
        ;
      }
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&className);
    }
  }
  return local_120;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}